

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::setLocale_helper(QWidgetPrivate *this,QLocale *loc,bool forceUpdate)

{
  QObject *pQVar1;
  long lVar2;
  QWidgetPrivate *this_00;
  byte bVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  bVar3 = QLocale::equals(&this->locale);
  if ((byte)(bVar3 ^ 1 | forceUpdate) == 1) {
    QLocale::operator=(&this->locale,loc);
    uVar4 = *(ulong *)&this->field_0x28;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        lVar2 = *(long *)(*(long *)&this->field_0x20 + uVar5 * 8);
        if ((((lVar2 != 0) &&
             (this_00 = *(QWidgetPrivate **)(lVar2 + 8), (this_00->field_0x30 & 1) != 0)) &&
            ((this_00->high_attributes[1] >> 0x17 & 1) == 0)) &&
           (((this_00->high_attributes[1] >> 0x10 & 1) != 0 ||
            ((*(uint *)(*(long *)(lVar2 + 0x20) + 0xc) & 1) == 0)))) {
          setLocale_helper(this_00,loc,forceUpdate);
          uVar4 = *(ulong *)&this->field_0x28;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar4);
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,LocaleChange);
    QCoreApplication::sendEvent(pQVar1,(QEvent *)&local_48);
    QEvent::~QEvent((QEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setLocale_helper(const QLocale &loc, bool forceUpdate)
{
    Q_Q(QWidget);
    if (locale == loc && !forceUpdate)
        return;

    locale = loc;

    if (!children.isEmpty()) {
        for (int i = 0; i < children.size(); ++i) {
            QWidget *w = qobject_cast<QWidget*>(children.at(i));
            if (!w)
                continue;
            if (w->testAttribute(Qt::WA_SetLocale))
                continue;
            if (w->isWindow() && !w->testAttribute(Qt::WA_WindowPropagation))
                continue;
            w->d_func()->setLocale_helper(loc, forceUpdate);
        }
    }
    QEvent e(QEvent::LocaleChange);
    QCoreApplication::sendEvent(q, &e);
}